

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix_sparse.c
# Opt level: O3

int check_vector(N_Vector x,N_Vector y,sunrealtype tol)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  
  lVar3 = N_VGetArrayPointer();
  lVar4 = N_VGetArrayPointer(y);
  lVar5 = N_VGetLength_Serial(x);
  lVar6 = N_VGetLength_Serial(y);
  if (lVar5 == lVar6) {
    if (lVar5 < 1) {
      uVar2 = 0;
    }
    else {
      lVar6 = 0;
      iVar7 = 0;
      do {
        iVar1 = SUNRCompareTol(*(undefined8 *)(lVar3 + lVar6 * 8),*(undefined8 *)(lVar4 + lVar6 * 8)
                               ,tol);
        iVar7 = iVar7 + iVar1;
        lVar6 = lVar6 + 1;
      } while (lVar5 != lVar6);
      uVar2 = (uint)(0 < iVar7);
    }
  }
  else {
    puts(">>> ERROR: check_vector: Different data array lengths ");
    uVar2 = 1;
  }
  return uVar2;
}

Assistant:

int check_vector(N_Vector x, N_Vector y, sunrealtype tol)
{
  int failure = 0;
  sunrealtype *xdata, *ydata;
  sunindextype xldata, yldata;
  sunindextype i;

  /* get vector data */
  xdata = N_VGetArrayPointer(x);
  ydata = N_VGetArrayPointer(y);

  /* check data lengths */
  xldata = N_VGetLength_Serial(x);
  yldata = N_VGetLength_Serial(y);

  if (xldata != yldata)
  {
    printf(">>> ERROR: check_vector: Different data array lengths \n");
    return (1);
  }

  /* check vector data */
  for (i = 0; i < xldata; i++)
  {
    failure += SUNRCompareTol(xdata[i], ydata[i], tol);
  }

  if (failure > ZERO) { return (1); }
  else { return (0); }
}